

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O0

void RemoveUVSeams(aiMesh *mesh,aiVector3D *out)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  aiFace *paVar4;
  uint local_3c;
  uint local_38;
  uint n_1;
  uint n;
  bool round_to_zero;
  bool one;
  uint uStack_2c;
  bool zero;
  uint large;
  uint small;
  aiFace *face;
  uint fidx;
  aiVector3D *out_local;
  aiMesh *mesh_local;
  
  for (face._4_4_ = 0; face._4_4_ < mesh->mNumFaces; face._4_4_ = face._4_4_ + 1) {
    paVar4 = mesh->mFaces + face._4_4_;
    if (2 < paVar4->mNumIndices) {
      n = paVar4->mNumIndices;
      bVar2 = false;
      bVar1 = false;
      bVar3 = false;
      uStack_2c = n;
      for (local_38 = 0; local_38 < paVar4->mNumIndices; local_38 = local_38 + 1) {
        if (out[paVar4->mIndices[local_38]].x <= 0.1 && out[paVar4->mIndices[local_38]].x != 0.1) {
          uStack_2c = local_38;
          if (0.01 < out[paVar4->mIndices[local_38]].x) {
            bVar3 = true;
          }
          else {
            bVar2 = true;
          }
        }
        if ((0.9 < out[paVar4->mIndices[local_38]].x) &&
           (n = local_38, 0.99 <= out[paVar4->mIndices[local_38]].x)) {
          bVar1 = true;
        }
      }
      if ((uStack_2c != paVar4->mNumIndices) && (n != paVar4->mNumIndices)) {
        for (local_3c = 0; local_3c < paVar4->mNumIndices; local_3c = local_3c + 1) {
          if ((out[paVar4->mIndices[local_3c]].x <= 0.9) || (bVar2)) {
            if ((0.1 < out[paVar4->mIndices[local_3c]].x || out[paVar4->mIndices[local_3c]].x == 0.1
                ) || (bVar1)) {
              if ((bVar1) && (bVar2)) {
                if ((!bVar3) || (out[paVar4->mIndices[local_3c]].x < 0.99)) {
                  if ((!bVar3) && (out[paVar4->mIndices[local_3c]].x <= 0.01)) {
                    out[paVar4->mIndices[local_3c]].x = 1.0;
                  }
                }
                else {
                  out[paVar4->mIndices[local_3c]].x = 0.0;
                }
              }
            }
            else {
              out[paVar4->mIndices[local_3c]].x = 1.0;
            }
          }
          else {
            out[paVar4->mIndices[local_3c]].x = 0.0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void RemoveUVSeams (aiMesh* mesh, aiVector3D* out)
{
    // TODO: just a very rough algorithm. I think it could be done
    // much easier, but I don't know how and am currently too tired to
    // to think about a better solution.

    const static ai_real LOWER_LIMIT = ai_real( 0.1 );
    const static ai_real UPPER_LIMIT = ai_real( 0.9 );

    const static ai_real LOWER_EPSILON = ai_real( 10e-3 );
    const static ai_real UPPER_EPSILON = ai_real( 1.0-10e-3 );

    for (unsigned int fidx = 0; fidx < mesh->mNumFaces;++fidx)
    {
        const aiFace& face = mesh->mFaces[fidx];
        if (face.mNumIndices < 3) continue; // triangles and polygons only, please

        unsigned int small = face.mNumIndices, large = small;
        bool zero = false, one = false, round_to_zero = false;

        // Check whether this face lies on a UV seam. We can just guess,
        // but the assumption that a face with at least one very small
        // on the one side and one very large U coord on the other side
        // lies on a UV seam should work for most cases.
        for (unsigned int n = 0; n < face.mNumIndices;++n)
        {
            if (out[face.mIndices[n]].x < LOWER_LIMIT)
            {
                small = n;

                // If we have a U value very close to 0 we can't
                // round the others to 0, too.
                if (out[face.mIndices[n]].x <= LOWER_EPSILON)
                    zero = true;
                else round_to_zero = true;
            }
            if (out[face.mIndices[n]].x > UPPER_LIMIT)
            {
                large = n;

                // If we have a U value very close to 1 we can't
                // round the others to 1, too.
                if (out[face.mIndices[n]].x >= UPPER_EPSILON)
                    one = true;
            }
        }
        if (small != face.mNumIndices && large != face.mNumIndices)
        {
            for (unsigned int n = 0; n < face.mNumIndices;++n)
            {
                // If the u value is over the upper limit and no other u
                // value of that face is 0, round it to 0
                if (out[face.mIndices[n]].x > UPPER_LIMIT && !zero)
                    out[face.mIndices[n]].x = 0.0;

                // If the u value is below the lower limit and no other u
                // value of that face is 1, round it to 1
                else if (out[face.mIndices[n]].x < LOWER_LIMIT && !one)
                    out[face.mIndices[n]].x = 1.0;

                // The face contains both 0 and 1 as UV coords. This can occur
                // for faces which have an edge that lies directly on the seam.
                // Due to numerical inaccuracies one U coord becomes 0, the
                // other 1. But we do still have a third UV coord to determine
                // to which side we must round to.
                else if (one && zero)
                {
                    if (round_to_zero && out[face.mIndices[n]].x >=  UPPER_EPSILON)
                        out[face.mIndices[n]].x = 0.0;
                    else if (!round_to_zero && out[face.mIndices[n]].x <= LOWER_EPSILON)
                        out[face.mIndices[n]].x = 1.0;
                }
            }
        }
    }
}